

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O3

int domindblast(void)

{
  monst *pmVar1;
  permonst *ppVar2;
  bool bVar3;
  monst *mon;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  obj *poVar7;
  char *pcVar8;
  int iVar9;
  
  if (u.uen < 10) {
    iVar9 = 0;
    pline("You concentrate but lack the energy to maintain doing so.");
  }
  else {
    u.uen = u.uen + -10;
    iflags.botl = '\x01';
    pline("You concentrate.");
    if ((uarmh == (obj *)0x0) || (uarmh->otyp != 0x4f)) {
      pline("A wave of psychic energy pours out.");
      iVar9 = 1;
      pmVar1 = level->monlist;
joined_r0x0021b9b5:
      mon = pmVar1;
      if (mon != (monst *)0x0) {
        pmVar1 = mon->nmon;
        if (((0 < mon->mhp) &&
            (iVar4 = dist2((int)mon->mx,(int)mon->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)) &&
           ((*(uint *)&mon->field_0x60 >> 0x16 & 1) == 0)) {
          ppVar2 = mon->data;
          if (ppVar2 == mons + 0x32 || (ppVar2 == mons + 0x31 || ppVar2 == mons + 0x1e)) {
            bVar3 = true;
            if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) != 0) {
              uVar5 = mt_random();
              if ((uVar5 & 1) == 0) goto LAB_0021ba5f;
              goto LAB_0021baa5;
            }
          }
          else {
LAB_0021ba5f:
            uVar5 = mt_random();
            if (((0x19999999 <
                  (uVar5 * -0x33333333 >> 1 | (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f)) ||
                (poVar7 = which_armor(mon,4), poVar7 == (obj *)0x0)) ||
               (poVar7 = which_armor(mon,4), poVar7->otyp == 0x4f)) goto joined_r0x0021b9b5;
LAB_0021baa5:
            bVar3 = false;
          }
          pcVar6 = mon_nam(mon);
          pcVar6 = s_suffix(pcVar6);
          pcVar8 = "telepathy";
          if (!bVar3) {
            ppVar2 = mon->data;
            pcVar8 = "mind";
            if (ppVar2 == mons + 0x32) {
              pcVar8 = "latent telepathy";
            }
            if (ppVar2 == mons + 0x31) {
              pcVar8 = "latent telepathy";
            }
            if (ppVar2 == mons + 0x1e) {
              pcVar8 = "latent telepathy";
            }
          }
          pline("You lock in on %s %s.",pcVar6,pcVar8);
          uVar5 = mt_random();
          iVar4 = ~(uVar5 % 0xf) + mon->mhp;
          mon->mhp = iVar4;
          if (iVar4 < 1) {
            killed(mon);
          }
        }
        goto joined_r0x0021b9b5;
      }
    }
    else {
      pcVar6 = yname(uarmh);
      iVar9 = 0;
      pline("A wave of psychic energy pours out, but it is blocked by %s.",pcVar6);
    }
  }
  return iVar9;
}

Assistant:

int domindblast(void)
{
	struct monst *mtmp, *nmon;

	if (u.uen < 10) {
	    pline("You concentrate but lack the energy to maintain doing so.");
	    return 0;
	}
	u.uen -= 10;
	iflags.botl = 1;

	pline("You concentrate.");
	if (uarmh && uarmh->otyp == TINFOIL_HAT) {
		pline("A wave of psychic energy pours out, but it is blocked by %s.",
		      yname(uarmh));
		return 0;
	}
	pline("A wave of psychic energy pours out.");
	for (mtmp=level->monlist; mtmp; mtmp = nmon) {
		int u_sen;

		nmon = mtmp->nmon;
		if (DEADMONSTER(mtmp))
			continue;
		if (distu(mtmp->mx, mtmp->my) > BOLT_LIM * BOLT_LIM)
			continue;
		if (mtmp->mpeaceful)
			continue;
		u_sen = telepathic(mtmp->data) && !mtmp->mcansee;
		if (u_sen || (telepathic(mtmp->data) && rn2(2)) ||
		    (!rn2(10) && which_armor(mtmp, W_ARMH) &&
		     which_armor(mtmp, W_ARMH)->otyp != TINFOIL_HAT)) {
			pline("You lock in on %s %s.", s_suffix(mon_nam(mtmp)),
				u_sen ? "telepathy" :
				telepathic(mtmp->data) ? "latent telepathy" :
				"mind");
			mtmp->mhp -= rnd(15);
			if (mtmp->mhp <= 0)
				killed(mtmp);
		}
	}
	return 1;
}